

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inference.cc
# Opt level: O2

void __thiscall xLearn::Predictor::Predict(Predictor *this)

{
  uint uVar1;
  int iVar2;
  ostream *poVar3;
  vector<float,_std::allocator<float>_> *siglen;
  Predictor *this_00;
  uchar *in_R8;
  size_t in_R9;
  float fVar4;
  undefined8 in_XMM0_Qa;
  undefined8 extraout_XMM0_Qa;
  DMatrix *matrix;
  string *local_238;
  ofstream o_file;
  
  if (this->res_out_ == true) {
    std::ofstream::ofstream(&o_file,(string *)&this->out_file_,_S_out);
    in_XMM0_Qa = std::ofstream::~ofstream(&o_file);
  }
  if (Predict()::out == '\0') {
    iVar2 = __cxa_guard_acquire(&Predict()::out);
    in_XMM0_Qa = extraout_XMM0_Qa;
    if (iVar2 != 0) {
      Predict::out.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage = (pointer)0x0;
      Predict::out.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
      ._M_start = (pointer)0x0;
      Predict::out.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
      ._M_finish = (pointer)0x0;
      __cxa_atexit(std::vector<float,_std::allocator<float>_>::~vector,&Predict::out,&__dso_handle);
      in_XMM0_Qa = __cxa_guard_release(&Predict()::out);
    }
  }
  matrix = (DMatrix *)0x0;
  (*this->reader_->_vptr_Reader[5])();
  (*this->loss_->_vptr_Loss[7])();
  local_238 = (string *)&this->out_file_;
  while( true ) {
    uVar1 = (*this->reader_->_vptr_Reader[4])(this->reader_,&matrix);
    fVar4 = (float)in_XMM0_Qa;
    if (uVar1 == 0) break;
    if ((long)Predict::out.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)Predict::out.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start >> 2 != (ulong)uVar1) {
      std::vector<float,_std::allocator<float>_>::resize(&Predict::out,(ulong)uVar1);
    }
    this_00 = (Predictor *)this->loss_;
    siglen = &Predict::out;
    (*(code *)(this_00->reader_->filename_).field_2._M_allocated_capacity)
              (this_00,matrix,this->model_);
    if (this->reader_->has_label_ == true) {
      this_00 = (Predictor *)this->loss_;
      (*(code *)(this_00->reader_->filename_)._M_string_length)(this_00,&Predict::out,&matrix->Y);
    }
    if (this->sigmoid_ == true) {
      sigmoid(this_00,&Predict::out,&Predict::out);
    }
    else if (this->sign_ == true) {
      sign(this_00,(EVP_PKEY_CTX *)&Predict::out,(uchar *)&Predict::out,(size_t *)siglen,in_R8,in_R9
          );
    }
    std::vector<float,std::allocator<float>>::
    insert<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,void>
              ((vector<float,std::allocator<float>> *)&this->out_,
               (const_iterator)
               (this->out_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish,
               (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
               Predict::out.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start,
               (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
               Predict::out.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish);
    if (this->res_out_ == true) {
      std::ofstream::ofstream(&o_file,local_238,_S_app);
      uVar1 = 0;
      while( true ) {
        if ((ulong)((long)Predict::out.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)Predict::out.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2) <= (ulong)uVar1) break;
        poVar3 = (ostream *)
                 std::ostream::operator<<
                           (&o_file,Predict::out.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start[uVar1]);
        std::operator<<(poVar3,"\n");
        uVar1 = uVar1 + 1;
      }
      in_XMM0_Qa = std::ofstream::~ofstream(&o_file);
    }
  }
  if (this->reader_->has_label_ == true) {
    (*this->loss_->_vptr_Loss[6])();
    StringPrintf_abi_cxx11_((string *)&o_file,"The test loss is: %.6f",(double)fVar4);
    Color::print_info((string *)&o_file,false);
    std::__cxx11::string::~string((string *)&o_file);
  }
  return;
}

Assistant:

void Predictor::Predict() {
  if (res_out_)
    std::ofstream o_file(out_file_);
  static std::vector<real_t> out;
  DMatrix* matrix = nullptr;
  reader_->Reset();
  loss_->Reset();
  for (;;) {
    index_t tmp = reader_->Samples(matrix);
    if (tmp == 0) { break; }
    if (tmp != out.size()) { out.resize(tmp); }
    loss_->Predict(matrix, *model_, out);
    if (reader_->has_label()) {
      loss_->Evaluate(out, matrix->Y);
    }
    if (sigmoid_) {
      this->sigmoid(out, out);
    } else if (sign_) {
      this->sign(out, out);
    }
    this->out_.insert(this->out_.end(), out.begin(), out.end());
    if (res_out_) {
      std::ofstream o_file(out_file_, std::ofstream::app);
      for (index_t i = 0; i < out.size(); ++i) {
        o_file << out[i] << "\n";
      }
    }
  }
  if (reader_->has_label()) {
    Color::print_info(
      StringPrintf("The test loss is: %.6f", 
        loss_->GetLoss())
    );
  }
}